

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,longdouble value)

{
  long in_RDI;
  iterator iVar1;
  type tVar2;
  unkbyte10 in_stack_00000008;
  format_specs *in_stack_000002a8;
  longdouble in_stack_000002b0;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_000002c0;
  undefined2 in_stack_ffffffffffffff80;
  undefined2 uVar3;
  undefined6 in_stack_ffffffffffffff82;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)
               CONCAT62(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80));
  }
  uVar3 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
  write_double<long_double>(in_stack_000002c0,in_stack_000002b0,in_stack_000002a8);
  iVar1 = arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
          ::out((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                 *)CONCAT62(in_stack_ffffffffffffff82,uVar3));
  tVar2.count_ = iVar1.count_;
  tVar2.blackhole_ = iVar1.blackhole_;
  tVar2._9_7_ = iVar1._9_7_;
  return tVar2;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }